

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<unsigned_int> metaf::WaveHeight::waveHeightFromStateOfSurfaceChar(char c)

{
  int *__t;
  char in_DIL;
  undefined7 in_stack_fffffffffffffff0;
  _Optional_base<unsigned_int,_true,_true> local_8;
  
  __t = (int *)(ulong)((int)in_DIL - 0x30);
  switch(__t) {
  case (int *)0x0:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x1:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x2:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x3:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x4:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x5:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x6:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x7:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x8:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  case (int *)0x9:
    std::optional<unsigned_int>::optional<const_int_&,_true>
              ((optional<unsigned_int> *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),__t);
    break;
  default:
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x25ddd7);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)
         local_8._M_payload.super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<unsigned int> WaveHeight::waveHeightFromStateOfSurfaceChar(char c) {
	switch (c) {
		case '0': return maxWaveHeightCalmGlassy;
		case '1': return maxWaveHeightCalmRippled;
		case '2': return maxWaveHeightSmooth;
		case '3': return maxWaveHeightSlight;
		case '4': return maxWaveHeightModerate;
		case '5': return maxWaveHeightRough;
		case '6': return maxWaveHeightVeryRough;
		case '7': return maxWaveHeightHigh;
		case '8': return maxWaveHeightVeryHigh;
		case '9': return minWaveHeightPhenomenal;
		default:  return std::optional<unsigned int>();
	}
}